

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnGlobalSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index global_index)

{
  Module *pMVar1;
  pointer ppGVar2;
  string_view name_00;
  string *orig_name;
  Enum EVar3;
  char *in_stack_ffffffffffffff78;
  Global *pGVar4;
  string dollar_name;
  __buckets_ptr local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  float local_38;
  
  orig_name = (string *)name.data_;
  EVar3 = Ok;
  if (name.size_ != 0) {
    pMVar1 = this->module_;
    ppGVar2 = (pMVar1->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)global_index <
        (ulong)((long)(pMVar1->globals).
                      super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3)) {
      pGVar4 = ppGVar2[global_index];
      name_00.size_ = (size_type)pGVar4;
      name_00.data_ = in_stack_ffffffffffffff78;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_00);
      GetUniqueName(&dollar_name,(BinaryReaderIR *)&pMVar1->global_bindings,(BindingHash *)&local_58
                    ,orig_name);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_assign((string *)pGVar4);
      uStack_48 = 0;
      uStack_44 = 0;
      local_58 = (__buckets_ptr)0x0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_38 = (float)global_index;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&this->module_->global_bindings,&dollar_name,&local_58);
      std::__cxx11::string::_M_dispose();
    }
    else {
      PrintError(this,"invalid global index: %u",(ulong)global_index);
      EVar3 = Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderIR::OnGlobalSymbol(Index index, uint32_t flags,
                                      string_view name, Index global_index) {
  if (name.empty()) {
    return Result::Ok;
  }
  if (global_index >= module_->globals.size()) {
    PrintError("invalid global index: %" PRIindex, global_index);
    return Result::Error;
  }
  Global* glob = module_->globals[global_index];
  std::string dollar_name =
      GetUniqueName(&module_->global_bindings, MakeDollarName(name));
  glob->name = dollar_name;
  module_->global_bindings.emplace(dollar_name, Binding(global_index));
  return Result::Ok;
}